

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>::
send_next_message(stats_controller_t<so_5::details::no_lock_holder_t> *this,duration pause,
                 int run_id)

{
  int local_c;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>_>
  local_8;
  
  local_c = run_id;
  local_8.m_ptr = this;
  impl::
  instantiator_and_sender_base<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,false>
  ::
  send_delayed<so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>>,int_const&>
            (this->m_env,&this->m_next_turn_mbox,pause,&local_8,&local_c);
  return;
}

Assistant:

void
		send_next_message(
			std::chrono::steady_clock::duration pause,
			const int run_id )
			{
				send_delayed< next_turn >(
						m_env,
						m_next_turn_mbox,
						pause,
						outliving_mutable( *this ),
						run_id );
			}